

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

Cell __thiscall cppforth::Forth::dataSpaceAtCell(Forth *this,Cell index)

{
  byte *pbVar1;
  Cell tmpRes;
  uint uVar2;
  pointer pVVar3;
  long lVar4;
  
  pVVar3 = (this->VirtualMemory).
           super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pVVar3 == (this->VirtualMemory).
                  super__Vector_base<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return 0;
    }
    if ((pVVar3->start <= index) && (index < pVVar3->end)) break;
    pVVar3 = pVVar3 + 1;
  }
  lVar4 = 0;
  uVar2 = 0;
  while( true ) {
    if (lVar4 == 0x20) {
      return uVar2;
    }
    if (pVVar3->end <= index) break;
    pbVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&pVVar3->segment,(ulong)(index - pVVar3->start));
    uVar2 = uVar2 | (uint)*pbVar1 << ((byte)lVar4 & 0x1f);
    index = index + 1;
    lVar4 = lVar4 + 8;
  }
  return uVar2;
}

Assistant:

Cell dataSpaceAtCell(Cell index){
			for (auto it = VirtualMemory.begin(), itend=VirtualMemory.end(); it != itend ; ++it){
				if ((*it).start <= index && (*it).end > index){
					Cell tmp{ 0 }, tmpRes{ 0 };
					for (size_t i = 0; i < sizeof(Cell) && (*it).end > index; ++i,++index){
						tmp=(*it).segment.at(index - (*it).start) ;
						tmp <<= 8*i;
						tmpRes |= tmp;
					}
					return tmpRes;		
				}
			}
			return Cell(0); // all memory is filled by 0x00
		}